

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Builder __thiscall
capnp::_::PointerBuilder::initBlob<capnp::Data>(PointerBuilder *this,ByteCount size)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  BuilderArena *this_00;
  uint uVar1;
  word *result;
  WirePointer *pWVar2;
  WirePointer *pWVar3;
  uint uVar4;
  AllocateResult AVar5;
  Builder BVar6;
  ThrowOverflow local_2a;
  anon_class_1_0_00000001 local_29;
  
  ref = this->pointer;
  segment = this->segment;
  capTable = this->capTable;
  uVar1 = assertMaxBits<29u,unsigned_int,kj::ThrowOverflow>(size,&local_2a);
  uVar4 = uVar1 + 7 >> 3;
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,capTable,ref);
  }
  pWVar2 = (WirePointer *)segment->pos;
  if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
             ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pWVar2)) >> 3 <
       (long)(ulong)uVar4) ||
     (segment->pos = (word *)(pWVar2 + uVar4), pWVar2 == (WirePointer *)0x0)) {
    this_00 = (BuilderArena *)(segment->super_SegmentReader).arena;
    uVar4 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                      (uVar4 + 1,&local_29);
    AVar5 = BuilderArena::allocate(this_00,uVar4);
    pWVar3 = (WirePointer *)AVar5.words;
    (ref->offsetAndKind).value =
         (int)AVar5.words - *(int *)&((AVar5.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U |
         2;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                   ((AVar5.segment)->super_SegmentReader).id.value;
    (pWVar3->offsetAndKind).value = 1;
    pWVar2 = pWVar3 + 1;
  }
  else {
    (ref->offsetAndKind).value = ((uint)((ulong)((long)pWVar2 - (long)ref) >> 1) & 0xfffffffc) - 3;
    pWVar3 = ref;
  }
  (pWVar3->field_1).upper32Bits = uVar1 * 8 + 2;
  BVar6.super_ArrayPtr<unsigned_char>.size_._0_4_ = uVar1;
  BVar6.super_ArrayPtr<unsigned_char>.ptr = (uchar *)pWVar2;
  BVar6.super_ArrayPtr<unsigned_char>.size_._4_4_ = 0;
  return (Builder)BVar6.super_ArrayPtr<unsigned_char>;
}

Assistant:

Data::Builder PointerBuilder::initBlob<Data>(ByteCount size) {
  return WireHelpers::initDataPointer(pointer, segment, capTable,
      assertMaxBits<BLOB_SIZE_BITS>(size, ThrowOverflow())).value;
}